

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O2

void fp::API::clearColor(int x,int y)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"clearColor ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void fp::API::clearColor(int x, int y) {
    std::cout << "clearColor " << x << " " << y << std::endl;
}